

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O2

string * __thiscall
MultiAgentDecisionProcessDiscrete::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MultiAgentDecisionProcessDiscrete *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  MultiAgentDecisionProcess::SoftPrint_abi_cxx11_(&local_1c0,&this->super_MultiAgentDecisionProcess)
  ;
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  MADPComponentDiscreteStates::SoftPrint_abi_cxx11_(&local_1c0,&this->_m_S);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  MADPComponentDiscreteActions::SoftPrint_abi_cxx11_(&local_1c0,&this->_m_A);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_(&local_1c0,&this->_m_O);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (this->_m_initialized == true) {
    poVar1 = std::operator<<(local_190,"Transition model: ");
    std::endl<char,std::char_traits<char>>(poVar1);
    (*(this->_m_p_tModel->super_TransitionModelDiscreteInterface).super_TransitionModel.
      _vptr_TransitionModel[3])(&local_1c0);
    std::operator<<(local_190,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    poVar1 = std::operator<<(local_190,"Observation model: ");
    std::endl<char,std::char_traits<char>>(poVar1);
    (*(this->_m_p_oModel->super_ObservationModelDiscreteInterface).super_ObservationModel.
      _vptr_ObservationModel[3])(&local_1c0);
    std::operator<<(local_190,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string MultiAgentDecisionProcessDiscrete::SoftPrint() const
{
    stringstream ss;

    ss << MultiAgentDecisionProcess::SoftPrint();
    ss << _m_S.SoftPrint();
    ss << _m_A.SoftPrint();
    ss << _m_O.SoftPrint();   
   
    if(_m_initialized)
    {
        ss << "Transition model: " << endl;
        ss << _m_p_tModel->SoftPrint();
        ss << "Observation model: " << endl;
        ss << _m_p_oModel->SoftPrint();
    }
    return(ss.str());
}